

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O0

char * TxtReplace(char *in_str,char *in_substr,char *out_substr,int recurse)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int local_64;
  int cpt;
  int dif;
  int l2;
  int l1;
  int sl;
  char *out_str;
  char *m2;
  char *m1;
  char *str_look;
  int recurse_local;
  char *out_substr_local;
  char *in_substr_local;
  char *in_str_local;
  
  if (in_str == (char *)0x0) {
    in_str_local = (char *)0x0;
  }
  else {
    sVar4 = strlen(in_str);
    l2 = (int)sVar4;
    sVar4 = strlen(in_substr);
    iVar1 = (int)sVar4;
    in_str_local = in_str;
    if ((l2 != 0) && (iVar1 != 0)) {
      sVar4 = strlen(out_substr);
      iVar2 = (int)sVar4;
      iVar3 = iVar2 - iVar1;
      _l1 = in_str;
      if (iVar3 < 1) {
        m1 = strstr(in_str,in_substr);
        while (m1 != (char *)0x0) {
          if (iVar2 != 0) {
            memcpy(m1,out_substr,(long)iVar2);
          }
          if (iVar1 != iVar2) {
            out_str = m1 + iVar2;
            for (m2 = m1 + iVar1; *m2 != '\0'; m2 = m2 + 1) {
              *out_str = *m2;
              out_str = out_str + 1;
            }
            *out_str = *m2;
          }
          if (recurse == 0) {
            m1 = strstr(m1 + iVar2,in_substr);
          }
          else {
            m1 = strstr(in_str,in_substr);
          }
        }
      }
      else {
        local_64 = 0;
        for (m1 = strstr(in_str,in_substr); m1 != (char *)0x0; m1 = strstr(m1 + iVar1,in_substr)) {
          local_64 = local_64 + 1;
        }
        if (local_64 != 0) {
          _l1 = (char *)realloc(in_str,(long)(l2 + 1 + iVar3 * local_64));
          m1 = strstr(_l1,in_substr);
          for (; m1 != (char *)0x0 && local_64 != 0; local_64 = local_64 + -1) {
            m2 = _l1 + l2;
            out_str = m2 + iVar3;
            l2 = iVar3 + l2;
            for (; m2 != m1 + ((long)iVar1 - (long)iVar3); m2 = m2 + -1) {
              *out_str = *m2;
              out_str = out_str + -1;
            }
            memcpy(m1,out_substr,(long)iVar2);
            if (recurse == 0) {
              m1 = strstr(m1 + iVar2,in_substr);
            }
            else {
              m1 = strstr(in_str,in_substr);
            }
          }
          if (m1 != (char *)0x0) {
            printf("INTERNAL ERROR - overlapping replace string (%s/%s), you can\'t use this one!\n"
                   ,in_substr,out_substr);
            exit(7);
          }
        }
      }
      in_str_local = _l1;
    }
  }
  return in_str_local;
}

Assistant:

char *TxtReplace(char *in_str, char *in_substr, char *out_substr, int recurse)
{
	#undef FUNC
	#define FUNC "TxtReplace"
	
	char *str_look,*m1,*m2;
	char *out_str;
	int sl,l1,l2,dif,cpt;

	if (in_str==NULL)
		return NULL;
		
	sl=strlen(in_str);
	l1=strlen(in_substr);
	/* empty string, nothing to do except return empty string */
	if (!sl || !l1)
		return in_str;
		
	l2=strlen(out_substr);
	dif=l2-l1;
		
	/* replace string is small or equal in size, we dont realloc */
	if (dif<=0)
	{
		/* we loop while there is a replace to do */
		str_look=strstr(in_str,in_substr);
		while (str_look!=NULL)
		{
			/*logdebug(str_look);*/
			
			/* we copy the new string if his len is not null */
			if (l2)
				memcpy(str_look,out_substr,l2);
			/* only if len are different */
			if (l1!=l2)
			{
				/* we move the end of the string byte per byte
				   because memory locations overlap. This is
				   faster than memmove */
				m1=str_look+l1;
				m2=str_look+l2;
				while (*m1!=0)
				{
					*m2=*m1;
					m1++;m2++;
				}
				/* we must copy the EOL */
				*m2=*m1;
			}
			/* look for next replace */
			if (!recurse)
				str_look=strstr(str_look+l2,in_substr);
			else
				str_look=strstr(in_str,in_substr);
		}
		out_str=in_str;
	}
	else
	{
		/* we need to count each replace */
		cpt=0;
		str_look=strstr(in_str,in_substr);
		while (str_look!=NULL)
		{
			cpt++;
			str_look=strstr(str_look+l1,in_substr);
		}
		/* is there anything to do? */
		if (cpt)
		{
			/* we realloc to a size that will fit all replaces */
			out_str=MemRealloc(in_str,sl+1+dif*cpt);
			str_look=strstr(out_str,in_substr);
			while (str_look!=NULL && cpt)
			{
				/* as the replace string is bigger we
				   have to move memory first from the end */
				m1=out_str+sl;
				m2=m1+dif;
				sl+=dif;
				while (m1!=str_look+l1-dif)
				{
					*m2=*m1;
					m1--;m2--;
				}
				/* then we copy the replace string (can't be NULL in this case) */
				memcpy(str_look,out_substr,l2);
				
				/* look for next replace */
				if (!recurse)
					str_look=strstr(str_look+l2,in_substr);
				else
					str_look=strstr(in_str,in_substr);
					
				/* to prevent from naughty overlap */
				cpt--;
			}
			if (str_look!=NULL)
			{
				printf("INTERNAL ERROR - overlapping replace string (%s/%s), you can't use this one!\n",in_substr,out_substr);
				exit(ABORT_ERROR);
			}
		}
		else
			out_str=in_str;
	}
	return out_str;
}